

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

void __thiscall
embree::avx::HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
::splitFallback(HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
                *this,PrimInfoExtRange *set,PrimInfoExtRange *lset,PrimInfoExtRange *rset)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar7;
  size_t lweight;
  size_t rweight;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  undefined1 auVar14 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  undefined1 auVar17 [16];
  
  uVar3 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  uVar5 = uVar4 + uVar3 >> 1;
  aVar8.m128[2] = INFINITY;
  aVar8._0_8_ = 0x7f8000007f800000;
  aVar8.m128[3] = INFINITY;
  aVar9.m128[2] = -INFINITY;
  aVar9._0_8_ = 0xff800000ff800000;
  aVar9.m128[3] = -INFINITY;
  lVar6 = uVar5 - uVar3;
  if (uVar5 < uVar3 || lVar6 == 0) {
    lweight = 0;
    aVar11 = aVar8;
    aVar10 = aVar9;
    aVar13 = aVar8;
    aVar12 = aVar9;
  }
  else {
    paVar7 = &this->prims0[uVar3].upper.field_0;
    aVar10.m128[2] = -INFINITY;
    aVar10._0_8_ = 0xff800000ff800000;
    aVar10.m128[3] = -INFINITY;
    aVar11.m128[2] = INFINITY;
    aVar11._0_8_ = 0x7f8000007f800000;
    aVar11.m128[3] = INFINITY;
    lweight = 0;
    aVar12 = aVar10;
    aVar13 = aVar11;
    do {
      lweight = lweight + (paVar7[-1].field_1.field_3.u >> 0x1b);
      aVar1 = paVar7[-1].field_1;
      aVar2 = paVar7->field_1;
      aVar11.m128 = (__m128)vminps_avx(aVar11.m128,(undefined1  [16])aVar1);
      aVar10.m128 = (__m128)vmaxps_avx(aVar10.m128,(undefined1  [16])aVar2);
      auVar14._0_4_ = aVar1.x + aVar2.x;
      auVar14._4_4_ = aVar1.y + aVar2.y;
      auVar14._8_4_ = aVar1.z + aVar2.z;
      auVar14._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
      aVar13.m128 = (__m128)vminps_avx(aVar13.m128,auVar14);
      aVar12.m128 = (__m128)vmaxps_avx(aVar12.m128,auVar14);
      paVar7 = paVar7 + 2;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  lVar6 = uVar4 - uVar5;
  if (uVar4 < uVar5 || lVar6 == 0) {
    rweight = 0;
    aVar16 = aVar8;
    aVar15 = aVar9;
  }
  else {
    paVar7 = &this->prims0[uVar5].upper.field_0;
    aVar15.m128[2] = -INFINITY;
    aVar15._0_8_ = 0xff800000ff800000;
    aVar15.m128[3] = -INFINITY;
    aVar16.m128[2] = INFINITY;
    aVar16._0_8_ = 0x7f8000007f800000;
    aVar16.m128[3] = INFINITY;
    rweight = 0;
    aVar9 = aVar15;
    aVar8 = aVar16;
    do {
      rweight = rweight + (paVar7[-1].field_1.field_3.u >> 0x1b);
      aVar1 = paVar7[-1].field_1;
      aVar2 = paVar7->field_1;
      aVar8.m128 = (__m128)vminps_avx(aVar8.m128,(undefined1  [16])aVar1);
      aVar9.m128 = (__m128)vmaxps_avx(aVar9.m128,(undefined1  [16])aVar2);
      auVar17._0_4_ = aVar1.x + aVar2.x;
      auVar17._4_4_ = aVar1.y + aVar2.y;
      auVar17._8_4_ = aVar1.z + aVar2.z;
      auVar17._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
      aVar16.m128 = (__m128)vminps_avx(aVar16.m128,auVar17);
      aVar15.m128 = (__m128)vmaxps_avx(aVar15.m128,auVar17);
      paVar7 = paVar7 + 2;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar11;
  (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar10;
  (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar13;
  (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar12;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar3;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar5;
  (lset->super_extended_range<unsigned_long>)._ext_end = uVar5;
  (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar8;
  (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar9;
  (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar16;
  (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar15;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar5;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar4;
  (rset->super_extended_range<unsigned_long>)._ext_end = uVar4;
  if ((set->super_extended_range<unsigned_long>)._ext_end !=
      (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end) {
    setExtentedRanges(this,set,lset,rset,lweight,rweight);
    moveExtentedRange(this,set,lset,rset);
    return;
  }
  return;
}

Assistant:

void splitFallback(const PrimInfoExtRange& set, 
                           PrimInfoExtRange& lset, 
                           PrimInfoExtRange& rset)
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          const size_t center = (begin + end)/2;

          PrimInfo left(empty);
          for (size_t i=begin; i<center; i++) {
            left.add_center2(prims0[i],prims0[i].lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));
          }
          const size_t lweight = left.end;
          
          PrimInfo right(empty);
          for (size_t i=center; i<end; i++) {
            right.add_center2(prims0[i],prims0[i].lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));	
          }
          const size_t rweight = right.end;

          new (&lset) PrimInfoExtRange(begin,center,center,left);
          new (&rset) PrimInfoExtRange(center,end,end,right);

          /* if we have an extended range */
          if (set.has_ext_range()) {
            setExtentedRanges(set,lset,rset,lweight,rweight);
            moveExtentedRange(set,lset,rset);
          }
        }